

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

bool crnlib::dxt_fast::determine_selectors
               (uint n,color_quad_u8 *block,uint min16,uint max16,uint8 *pSelectors)

{
  uint8 uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  int stops [4];
  color_quad_u8 color [4];
  int local_48 [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_38;
  byte local_34;
  byte local_33;
  byte local_32;
  
  if (max16 == min16) {
    bVar5 = false;
    memset(pSelectors,0,(ulong)n);
  }
  else {
    eval_colors((color_quad_u8 *)&local_38.field_0,min16,max16);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      local_48[lVar2] =
           (uint)local_38.c[lVar2 * 4 + 2] * ((uint)local_38.field_0.b - (uint)local_32) +
           (uint)local_38.c[lVar2 * 4 + 1] * ((uint)local_38.field_0.g - (uint)local_33) +
           (uint)local_38.c[lVar2 * 4] * ((uint)local_38.field_0.r - (uint)local_34);
    }
    bVar5 = false;
    for (uVar3 = 0; n != uVar3; uVar3 = uVar3 + 1) {
      iVar4 = (uint)block[uVar3].field_0.field_0.b * ((uint)local_38.field_0.b - (uint)local_32) +
              (uint)block[uVar3].field_0.field_0.g * ((uint)local_38.field_0.g - (uint)local_33) +
              (uint)block[uVar3].field_0.field_0.r * ((uint)local_38.field_0.r - (uint)local_34);
      uVar1 = (local_48[1] + local_48[3] >> 1 <= iVar4) * '\x02' + '\x01';
      if (local_48[3] + local_48[2] >> 1 <= iVar4) {
        uVar1 = (iVar4 < local_48[2] + local_48[0] >> 1) * '\x02';
      }
      pSelectors[uVar3] = uVar1;
      bVar5 = (bool)(bVar5 | uVar1 != *pSelectors);
    }
  }
  return bVar5;
}

Assistant:

static bool determine_selectors(uint n, const color_quad_u8* block, uint min16, uint max16, uint8* pSelectors) {
  color_quad_u8 color[4];

  if (max16 != min16) {
    eval_colors(color, min16, max16);

    return match_block_colors(n, block, color, pSelectors);
  }

  memset(pSelectors, 0, n);
  return false;
}